

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

VmValue * CompileVmTypeCast(ExpressionContext *ctx,VmModule *module,ExprTypeCast *node)

{
  VmValueType VVar1;
  _func_int **pp_Var2;
  TypeBase *pTVar3;
  TypeBase *pTVar4;
  VmModule *pVVar5;
  undefined1 auVar6 [16];
  VmValueType VVar7;
  VmInstruction *address;
  TypeRef *pTVar8;
  VmConstant *pVVar9;
  VmInstruction *pVVar10;
  VmInstruction *el1;
  SynBase *pSVar11;
  VmValue *source;
  uint uVar12;
  VmValue *in_R9;
  VmType type;
  VmType type_00;
  VmType VVar13;
  VmType VVar14;
  TypeBase *pTStackY_50;
  uint uVar15;
  VmValue *in_stack_ffffffffffffffb8;
  VmValue *in_stack_ffffffffffffffc0;
  TypeBase *local_38;
  
  address = (VmInstruction *)CompileVm(ctx,module,node->value);
  switch(node->category) {
  case EXPR_CAST_NUMERICAL:
    pTVar3 = (node->super_ExprBase).type;
    if (pTVar3 != ctx->typeBool) {
      pVVar5 = (VmModule *)(node->super_ExprBase).source;
      VVar13 = GetVmType(ctx,pTVar3);
      VVar1 = (address->super_VmValue).type.type;
      uVar15 = (address->super_VmValue).type.size;
      VVar7 = VVar13.type;
      uVar12 = VVar13.size;
      if ((VVar1 != VVar7) || (uVar15 != uVar12)) {
        if (uVar12 == 4 && VVar7 == VM_TYPE_INT) {
          if (uVar15 == 8 && VVar1 == VM_TYPE_DOUBLE) {
            pSVar11 = (SynBase *)0x400000001;
            pTStackY_50 = (TypeBase *)0xf;
          }
          else {
            if ((VVar1 != VM_TYPE_LONG) || (uVar15 != 8)) goto LAB_0024d3bf;
            pSVar11 = (SynBase *)0x400000001;
            pTStackY_50 = (TypeBase *)0x15;
          }
        }
        else if (uVar12 == 8 && VVar7 == VM_TYPE_DOUBLE) {
          if (uVar15 == 4 && VVar1 == VM_TYPE_INT) {
            pSVar11 = (SynBase *)0x800000002;
            pTStackY_50 = (TypeBase *)0x12;
          }
          else {
            if ((VVar1 != VM_TYPE_LONG) || (uVar15 != 8)) goto LAB_0024d3bf;
            pSVar11 = (SynBase *)0x800000002;
            pTStackY_50 = (TypeBase *)0x13;
          }
        }
        else {
          if ((VVar7 != VM_TYPE_LONG) || (uVar12 != 8)) {
LAB_0024d3bf:
            __assert_fail("!\"unknown cast\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0x206,
                          "VmValue *(anonymous namespace)::CreateCast(VmModule *, SynBase *, VmValue *, VmType)"
                         );
          }
          if (uVar15 == 4 && VVar1 == VM_TYPE_INT) {
            pSVar11 = (SynBase *)0x800000003;
            pTStackY_50 = (TypeBase *)0x14;
          }
          else {
            if ((VVar1 != VM_TYPE_DOUBLE) || (uVar15 != 8)) goto LAB_0024d3bf;
            pSVar11 = (SynBase *)0x800000003;
            pTStackY_50 = (TypeBase *)0x10;
          }
        }
        type_00.structType = pTStackY_50;
        type_00._0_8_ = VVar13.structType;
        address = anon_unknown.dwarf_20a43d::CreateInstruction
                            ((anon_unknown_dwarf_20a43d *)module,pVVar5,pSVar11,type_00,
                             (VmInstructionType)address,in_stack_ffffffffffffffb8);
      }
      goto LAB_0024d34b;
    }
    VVar1 = (address->super_VmValue).type.type;
    uVar15 = (address->super_VmValue).type.size;
    if (uVar15 == 4 && VVar1 == VM_TYPE_INT) {
      pSVar11 = (node->super_ExprBase).source;
      pVVar9 = CreateConstantInt(module->allocator,pSVar11,0);
    }
    else if (uVar15 == 8 && VVar1 == VM_TYPE_DOUBLE) {
      pSVar11 = (node->super_ExprBase).source;
      pVVar9 = CreateConstantDouble(module->allocator,pSVar11,0.0);
    }
    else {
      if ((VVar1 != VM_TYPE_LONG) || (uVar15 != 8)) {
        __assert_fail("!\"unknown type\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0xa95,
                      "VmValue *CompileVmTypeCast(ExpressionContext &, VmModule *, ExprTypeCast *)")
        ;
      }
      pSVar11 = (node->super_ExprBase).source;
      pVVar9 = CreateConstantLong(module->allocator,pSVar11,0);
    }
    break;
  case EXPR_CAST_PTR_TO_BOOL:
    goto switchD_0024cc35_caseD_1;
  case EXPR_CAST_UNSIZED_TO_BOOL:
    pTVar3 = node->value->type;
    if ((pTVar3 == (TypeBase *)0x0) || (pTVar3->typeID != 0x14)) goto LAB_0024d34b;
    pVVar5 = (VmModule *)(node->super_ExprBase).source;
    pTVar8 = ExpressionContext::GetReferenceType(ctx,*(TypeBase **)&pTVar3[1].typeIndex);
    uVar15 = (uint)in_stack_ffffffffffffffb8;
    VVar13 = VmType::Pointer(&pTVar8->super_TypeBase);
    type.structType = (TypeBase *)address;
    type._0_8_ = VVar13.structType;
    address = (VmInstruction *)
              anon_unknown.dwarf_20a43d::CreateExtract
                        ((anon_unknown_dwarf_20a43d *)module,pVVar5,VVar13._0_8_,type,(VmValue *)0x0
                         ,uVar15);
    goto switchD_0024cc35_caseD_1;
  case EXPR_CAST_FUNCTION_TO_BOOL:
    auVar6._8_8_ = 0;
    auVar6._0_8_ = address;
    pVVar10 = (VmInstruction *)
              anon_unknown.dwarf_20a43d::CreateExtract
                        ((anon_unknown_dwarf_20a43d *)module,
                         (VmModule *)(node->super_ExprBase).source,(SynBase *)0x400000001,
                         (VmType)(auVar6 << 0x40),(VmValue *)0x8,(uint)in_stack_ffffffffffffffb8);
    if (pVVar10 == (VmInstruction *)0x0) goto LAB_0024d34b;
    pSVar11 = (node->super_ExprBase).source;
    pVVar9 = CreateConstantInt(module->allocator,pSVar11,0);
    address = pVVar10;
    break;
  case EXPR_CAST_NULL_TO_PTR:
    address = (VmInstruction *)
              CreateConstantPointer
                        (module->allocator,(node->super_ExprBase).source,0,(VariableData *)0x0,
                         (node->super_ExprBase).type,false);
    goto LAB_0024d34b;
  case EXPR_CAST_NULL_TO_AUTO_PTR:
    source = (VmValue *)(node->super_ExprBase).source;
    VVar13 = GetVmType(ctx,(node->super_ExprBase).type);
    pVVar10 = (VmInstruction *)CreateConstantInt(module->allocator,(node->super_ExprBase).source,0);
    el1 = (VmInstruction *)
          CreateConstantPointer
                    (module->allocator,(node->super_ExprBase).source,0,(VariableData *)0x0,
                     ctx->typeNullPtr,false);
    goto LAB_0024d002;
  case EXPR_CAST_NULL_TO_UNSIZED:
  case EXPR_CAST_NULL_TO_FUNCTION:
    source = (VmValue *)(node->super_ExprBase).source;
    VVar13 = GetVmType(ctx,(node->super_ExprBase).type);
    pVVar10 = (VmInstruction *)
              CreateConstantPointer
                        (module->allocator,(node->super_ExprBase).source,0,(VariableData *)0x0,
                         ctx->typeNullPtr,false);
    el1 = (VmInstruction *)CreateConstantInt(module->allocator,(node->super_ExprBase).source,0);
    goto LAB_0024d002;
  case EXPR_CAST_NULL_TO_AUTO_ARRAY:
    source = (VmValue *)(node->super_ExprBase).source;
    VVar13 = GetVmType(ctx,(node->super_ExprBase).type);
    pVVar10 = (VmInstruction *)CreateConstantInt(module->allocator,(node->super_ExprBase).source,0);
    el1 = (VmInstruction *)
          CreateConstantPointer
                    (module->allocator,(node->super_ExprBase).source,0,(VariableData *)0x0,
                     ctx->typeNullPtr,false);
    pVVar9 = CreateConstantInt(module->allocator,(node->super_ExprBase).source,0);
    in_stack_ffffffffffffffc0 = source;
    goto LAB_0024d163;
  case EXPR_CAST_ARRAY_PTR_TO_UNSIZED:
    pTVar3 = node->value->type;
    if ((pTVar3 == (TypeBase *)0x0) || (pTVar3->typeID != 0x12)) goto LAB_0024d34b;
    pp_Var2 = pTVar3[1]._vptr_TypeBase;
    if ((pp_Var2 == (_func_int **)0x0) || (*(int *)(pp_Var2 + 1) != 0x13)) {
      __assert_fail("arrType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0xaba,
                    "VmValue *CompileVmTypeCast(ExpressionContext &, VmModule *, ExprTypeCast *)");
    }
    if (*(int *)((long)pp_Var2 + 0x6c) != 0) {
      __assert_fail("unsigned(arrType->length) == arrType->length",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0xabb,
                    "VmValue *CompileVmTypeCast(ExpressionContext &, VmModule *, ExprTypeCast *)");
    }
    source = (VmValue *)(node->super_ExprBase).source;
    VVar13 = GetVmType(ctx,(node->super_ExprBase).type);
    el1 = (VmInstruction *)
          CreateConstantInt(module->allocator,(node->super_ExprBase).source,*(int *)(pp_Var2 + 0xd))
    ;
    pVVar10 = address;
LAB_0024d002:
    pVVar9 = (VmConstant *)0x0;
    in_stack_ffffffffffffffc0 = source;
LAB_0024d163:
    address = (VmInstruction *)
              anon_unknown.dwarf_20a43d::CreateConstruct
                        (module,(SynBase *)source,VVar13,&pVVar10->super_VmValue,&el1->super_VmValue
                         ,&pVVar9->super_VmValue,in_stack_ffffffffffffffc0);
    goto LAB_0024d34b;
  case EXPR_CAST_PTR_TO_AUTO_PTR:
    pTVar3 = node->value->type;
    if ((pTVar3 == (TypeBase *)0x0) || (pTVar3->typeID != 0x12)) goto LAB_0024d34b;
    pTVar3 = (TypeBase *)pTVar3[1]._vptr_TypeBase;
    if (((pTVar3 == (TypeBase *)0x0) || (pTVar3->typeID != 0x18)) ||
       ((*(char *)&pTVar3[2].arrayTypes.tail == '\0' &&
        (pTVar3[2].unsizedArrayType == (TypeUnsizedArray *)0x0)))) {
      pVVar10 = (VmInstruction *)
                anon_unknown.dwarf_20a43d::CreateTypeIndex
                          (module,(node->super_ExprBase).source,pTVar3);
    }
    else {
      pVVar10 = (VmInstruction *)
                anon_unknown.dwarf_20a43d::CreateLoad
                          (ctx,module,(node->super_ExprBase).source,ctx->typeTypeID,
                           (VmValue *)address,(uint)in_R9);
    }
    source = (VmValue *)(node->super_ExprBase).source;
    VVar13 = GetVmType(ctx,(node->super_ExprBase).type);
    goto LAB_0024d160;
  case EXPR_CAST_AUTO_PTR_TO_PTR:
    pTVar3 = (node->super_ExprBase).type;
    if ((pTVar3 != (TypeBase *)0x0) && (pTVar3->typeID == 0x12)) {
      pVVar5 = (VmModule *)(node->super_ExprBase).source;
      pTVar3 = (TypeBase *)pTVar3[1]._vptr_TypeBase;
      pTVar8 = ExpressionContext::GetReferenceType(ctx,pTVar3);
      VVar13 = VmType::Pointer(&pTVar8->super_TypeBase);
      pVVar9 = CreateConstantInt(module->allocator,(SynBase *)pVVar5,pTVar3->typeIndex);
      local_38 = VVar13.structType;
      VVar14.structType = (TypeBase *)0x47;
      VVar14._0_8_ = local_38;
      address = anon_unknown.dwarf_20a43d::CreateInstruction
                          ((anon_unknown_dwarf_20a43d *)module,pVVar5,VVar13._0_8_,VVar14,
                           (VmInstructionType)address,&pVVar9->super_VmValue,(VmValue *)VVar13._0_8_
                          );
    }
    goto LAB_0024d34b;
  case EXPR_CAST_UNSIZED_TO_AUTO_ARRAY:
    pTVar3 = node->value->type;
    if ((pTVar3 == (TypeBase *)0x0) || (pTVar3->typeID != 0x14)) goto LAB_0024d34b;
    source = (VmValue *)(node->super_ExprBase).source;
    VVar13 = GetVmType(ctx,(node->super_ExprBase).type);
    pVVar10 = (VmInstruction *)
              anon_unknown.dwarf_20a43d::CreateTypeIndex
                        (module,(node->super_ExprBase).source,*(TypeBase **)&pTVar3[1].typeIndex);
    in_stack_ffffffffffffffc0 = source;
LAB_0024d160:
    pVVar9 = (VmConstant *)0x0;
    el1 = address;
    goto LAB_0024d163;
  case EXPR_CAST_REINTERPRET:
    pTVar3 = (node->super_ExprBase).type;
    pTVar4 = node->value->type;
    if ((pTVar3 != pTVar4) && (pTVar3 != (TypeBase *)0x0)) {
      uVar15 = pTVar3->typeID;
      if (uVar15 == 0x14) {
        if ((pTVar4 == (TypeBase *)0x0) || (pTVar4->typeID != 0x14)) goto LAB_0024d34b;
      }
      else if (pTVar4 == (TypeBase *)0x0 || uVar15 != 0x12) {
        if ((pTVar4 == (TypeBase *)0x0 || uVar15 != 0x15) || (pTVar4->typeID != 0x15))
        goto LAB_0024d34b;
      }
      else if (pTVar4->typeID != 0x12) goto LAB_0024d34b;
      if (((address == (VmInstruction *)0x0) || ((address->super_VmValue).typeID != 2)) ||
         (address->cmd != VM_INST_CALL)) {
        pVVar5 = (VmModule *)(node->super_ExprBase).source;
        VVar14 = GetVmType(ctx,pTVar3);
        VVar13.structType = (TypeBase *)address;
        VVar13._0_8_ = VVar14.structType;
        address = (VmInstruction *)
                  anon_unknown.dwarf_20a43d::CreateBitcast
                            ((anon_unknown_dwarf_20a43d *)module,pVVar5,VVar14._0_8_,VVar13,in_R9);
      }
      else {
        VVar13 = GetVmType(ctx,pTVar3);
        (address->super_VmValue).type = VVar13;
      }
    }
    goto LAB_0024d34b;
  default:
    __assert_fail("!\"unknown cast\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0xb12,
                  "VmValue *CompileVmTypeCast(ExpressionContext &, VmModule *, ExprTypeCast *)");
  }
LAB_0024cedb:
  address = (VmInstruction *)
            anon_unknown.dwarf_20a43d::CreateCompareNotEqual
                      (module,pSVar11,&address->super_VmValue,&pVVar9->super_VmValue);
LAB_0024d34b:
  anon_unknown.dwarf_20a43d::CheckType(ctx,&node->super_ExprBase,&address->super_VmValue);
  return &address->super_VmValue;
switchD_0024cc35_caseD_1:
  pSVar11 = (node->super_ExprBase).source;
  pVVar9 = CreateConstantPointer
                     (module->allocator,pSVar11,0,(VariableData *)0x0,ctx->typeNullPtr,false);
  goto LAB_0024cedb;
}

Assistant:

VmValue* CompileVmTypeCast(ExpressionContext &ctx, VmModule *module, ExprTypeCast *node)
{
	VmValue *value = CompileVm(ctx, module, node->value);

	switch(node->category)
	{
	case EXPR_CAST_NUMERICAL:
		if(node->type == ctx.typeBool)
		{
			if(value->type == VmType::Int)
				return CheckType(ctx, node, CreateCompareNotEqual(module, node->source, value, CreateConstantInt(module->allocator, node->source, 0)));

			if(value->type == VmType::Double)
				return CheckType(ctx, node, CreateCompareNotEqual(module, node->source, value, CreateConstantDouble(module->allocator, node->source, 0.0)));

			if(value->type == VmType::Long)
				return CheckType(ctx, node, CreateCompareNotEqual(module, node->source, value, CreateConstantLong(module->allocator, node->source, 0ll)));

			assert(!"unknown type");
		}

		return CheckType(ctx, node, CreateCast(module, node->source, value, GetVmType(ctx, node->type)));
	case EXPR_CAST_PTR_TO_BOOL:
		return CheckType(ctx, node, CreateCompareNotEqual(module, node->source, value, CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false)));
	case EXPR_CAST_UNSIZED_TO_BOOL:
		if(TypeUnsizedArray *unsizedArrType = getType<TypeUnsizedArray>(node->value->type))
		{
			VmValue *ptr = CreateExtract(module, node->source, VmType::Pointer(ctx.GetReferenceType(unsizedArrType->subType)), value, 0);

			return CheckType(ctx, node, CreateCompareNotEqual(module, node->source, ptr, CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false)));
		}
		
		break;
	case EXPR_CAST_FUNCTION_TO_BOOL:
		if(VmValue *index = CreateExtract(module, node->source, VmType::Int, value, sizeof(void*)))
		{
			return CheckType(ctx, node, CreateCompareNotEqual(module, node->source, index, CreateConstantInt(module->allocator, node->source, 0)));
		}

		break;
	case EXPR_CAST_NULL_TO_PTR:
		return CheckType(ctx, node, CreateConstantPointer(module->allocator, node->source, 0, NULL, node->type, false));
	case EXPR_CAST_NULL_TO_AUTO_PTR:
		return CheckType(ctx, node, CreateConstruct(module, node->source, GetVmType(ctx, node->type), CreateConstantInt(module->allocator, node->source, 0), CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false), NULL, NULL));
	case EXPR_CAST_NULL_TO_UNSIZED:
		return CheckType(ctx, node, CreateConstruct(module, node->source, GetVmType(ctx, node->type), CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false), CreateConstantInt(module->allocator, node->source, 0), NULL, NULL));
	case EXPR_CAST_NULL_TO_AUTO_ARRAY:
		return CheckType(ctx, node, CreateConstruct(module, node->source, GetVmType(ctx, node->type), CreateConstantInt(module->allocator, node->source, 0), CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false), CreateConstantInt(module->allocator, node->source, 0), NULL));
	case EXPR_CAST_NULL_TO_FUNCTION:
		return CheckType(ctx, node, CreateConstruct(module, node->source, GetVmType(ctx, node->type), CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false), CreateConstantInt(module->allocator, node->source, 0), NULL, NULL));
	case EXPR_CAST_ARRAY_PTR_TO_UNSIZED:
		if(TypeRef *refType = getType<TypeRef>(node->value->type))
		{
			TypeArray *arrType = getType<TypeArray>(refType->subType);

			assert(arrType);
			assert(unsigned(arrType->length) == arrType->length);

			return CheckType(ctx, node, CreateConstruct(module, node->source, GetVmType(ctx, node->type), value, CreateConstantInt(module->allocator, node->source, unsigned(arrType->length)), NULL, NULL));
		}

		break;
	case EXPR_CAST_PTR_TO_AUTO_PTR:
		if(TypeRef *refType = getType<TypeRef>(node->value->type))
		{
			TypeClass *classType = getType<TypeClass>(refType->subType);

			VmValue *typeId = NULL;

			if(classType && (classType->extendable || classType->baseClass))
				typeId = CreateLoad(ctx, module, node->source, ctx.typeTypeID, value, 0);
			else
				typeId = CreateTypeIndex(module, node->source, refType->subType);

			return CheckType(ctx, node, CreateConstruct(module, node->source, GetVmType(ctx, node->type), typeId, value, NULL, NULL));
		}
		break;
	case EXPR_CAST_AUTO_PTR_TO_PTR:
		if(TypeRef *refType = getType<TypeRef>(node->type))
		{
			return CheckType(ctx, node, CreateConvertPtr(module, node->source, value, refType->subType, ctx.GetReferenceType(refType->subType)));
		}

		break;
	case EXPR_CAST_UNSIZED_TO_AUTO_ARRAY:
		if(TypeUnsizedArray *unsizedType = getType<TypeUnsizedArray>(node->value->type))
		{
			return CheckType(ctx, node, CreateConstruct(module, node->source, GetVmType(ctx, node->type), CreateTypeIndex(module, node->source, unsizedType->subType), value, NULL, NULL));
		}

		break;
	case EXPR_CAST_REINTERPRET:
		if(node->type == node->value->type)
			return CheckType(ctx, node, value);

		if(isType<TypeUnsizedArray>(node->type) && isType<TypeUnsizedArray>(node->value->type))
		{
			// Try changing the target call type
			if(VmInstruction *inst = getType<VmInstruction>(value))
			{
				if(inst->cmd == VM_INST_CALL)
				{
					inst->type = GetVmType(ctx, node->type);

					return CheckType(ctx, node, value);
				}
			}

			return CheckType(ctx, node, CreateBitcast(module, node->source, GetVmType(ctx, node->type), value));
		}
		else if(isType<TypeRef>(node->type) && isType<TypeRef>(node->value->type))
		{
			// Try changing the target call type
			if(VmInstruction *inst = getType<VmInstruction>(value))
			{
				if(inst->cmd == VM_INST_CALL)
				{
					inst->type = GetVmType(ctx, node->type);

					return CheckType(ctx, node, value);
				}
			}

			return CheckType(ctx, node, CreateBitcast(module, node->source, GetVmType(ctx, node->type), value));
		}
		else if(isType<TypeFunction>(node->type) && isType<TypeFunction>(node->value->type))
		{
			// Try changing the target call type
			if(VmInstruction *inst = getType<VmInstruction>(value))
			{
				if(inst->cmd == VM_INST_CALL)
				{
					inst->type = GetVmType(ctx, node->type);

					return CheckType(ctx, node, value);
				}
			}

			return CheckType(ctx, node, CreateBitcast(module, node->source, GetVmType(ctx, node->type), value));
		}

		return CheckType(ctx, node, value);
	default:
		assert(!"unknown cast");
	}

	return CheckType(ctx, node, value);
}